

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O3

bool __thiscall rotate_y::hit(rotate_y *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  uint uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  
  dVar16 = (r->dir).e[1];
  dVar1 = (r->dir).e[0];
  dVar2 = (r->dir).e[2];
  dVar9 = this->sin_theta;
  dVar10 = this->cos_theta;
  iVar11 = (**((this->ptr).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_hittable)(t_min,t_max);
  if (SUB41(iVar11,0) != false) {
    dVar3 = (rec->normal).e[1];
    dVar4 = this->sin_theta;
    dVar5 = this->cos_theta;
    dVar6 = (rec->p).e[0];
    dVar7 = (rec->p).e[2];
    dVar13 = (rec->normal).e[0];
    dVar8 = (rec->normal).e[2];
    dVar15 = dVar5 * dVar13 + dVar4 * dVar8;
    dVar13 = dVar5 * dVar8 - dVar4 * dVar13;
    (rec->p).e[0] = dVar5 * dVar6 + dVar4 * dVar7;
    (rec->p).e[2] = dVar7 * dVar5 - dVar6 * dVar4;
    dVar16 = (dVar9 * dVar1 + dVar10 * dVar2) * dVar13 +
             (dVar1 * dVar10 + -dVar9 * dVar2) * dVar15 + dVar16 * dVar3;
    rec->front_face = dVar16 < 0.0;
    if (0.0 <= dVar16) {
      dVar13 = -dVar13;
    }
    uVar12 = (uint)(dVar16 < 0.0);
    auVar14._0_8_ = CONCAT44((int)(uVar12 << 0x1f) >> 0x1f,(int)(uVar12 << 0x1f) >> 0x1f);
    auVar14._8_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
    auVar14._12_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
    (rec->normal).e[0] = (double)(~auVar14._0_8_ & (ulong)-dVar15 | (ulong)dVar15 & auVar14._0_8_);
    (rec->normal).e[1] = (double)(~auVar14._8_8_ & (ulong)-dVar3 | (ulong)dVar3 & auVar14._8_8_);
    (rec->normal).e[2] = dVar13;
  }
  return SUB41(iVar11,0);
}

Assistant:

bool rotate_y::hit(const ray& r, double t_min, double t_max, hit_record& rec) const {
    vec3 origin = r.origin();
    vec3 direction = r.direction();

    origin[0] = cos_theta*r.origin()[0] - sin_theta*r.origin()[2];
    origin[2] = sin_theta*r.origin()[0] + cos_theta*r.origin()[2];

    direction[0] = cos_theta*r.direction()[0] - sin_theta*r.direction()[2];
    direction[2] = sin_theta*r.direction()[0] + cos_theta*r.direction()[2];

    ray rotated_r(origin, direction, r.time());

    if (!ptr->hit(rotated_r, t_min, t_max, rec))
        return false;

    vec3 p = rec.p;
    vec3 normal = rec.normal;

    p[0] =  cos_theta*rec.p[0] + sin_theta*rec.p[2];
    p[2] = -sin_theta*rec.p[0] + cos_theta*rec.p[2];

    normal[0] =  cos_theta*rec.normal[0] + sin_theta*rec.normal[2];
    normal[2] = -sin_theta*rec.normal[0] + cos_theta*rec.normal[2];

    rec.p = p;
    rec.set_face_normal(rotated_r, normal);

    return true;
}